

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyConnectivity.cc
# Opt level: O0

HalfedgeHandle __thiscall
OpenMesh::PolyConnectivity::find_halfedge
          (PolyConnectivity *this,VertexHandle _start_vh,VertexHandle _end_vh)

{
  bool bVar1;
  value_type vVar2;
  bool local_45;
  BaseHandle local_40;
  BaseHandle local_3c;
  undefined1 local_38 [8];
  ConstVertexOHalfedgeIter voh_it;
  PolyConnectivity *this_local;
  BaseHandle local_10;
  VertexHandle _end_vh_local;
  VertexHandle _start_vh_local;
  
  voh_it.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._16_8_ = this;
  this_local._4_4_ = _end_vh.super_BaseHandle.idx_;
  local_10 = _start_vh.super_BaseHandle.idx_;
  bVar1 = BaseHandle::is_valid(&local_10);
  local_45 = false;
  if (bVar1) {
    local_45 = BaseHandle::is_valid((BaseHandle *)((long)&this_local + 4));
  }
  if (local_45 != false) {
    local_3c.idx_ = local_10.idx_;
    cvoh_iter((ConstVertexOHalfedgeIter *)local_38,this,(VertexHandle)local_10.idx_);
    while( true ) {
      bVar1 = Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
              ::is_valid((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                          *)local_38);
      if (!bVar1) {
        return (BaseHandle)(BaseHandle)InvalidHalfedgeHandle.idx_;
      }
      vVar2 = Iterators::
              GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
              ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                           *)local_38);
      local_40.idx_ =
           (int)ArrayKernel::to_vertex_handle(&this->super_ArrayKernel,vVar2.super_BaseHandle.idx_);
      bVar1 = BaseHandle::operator==(&local_40,(BaseHandle *)((long)&this_local + 4));
      if (bVar1) break;
      Iterators::
      GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
      ::operator++((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                    *)local_38);
    }
    vVar2 = Iterators::
            GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
            ::operator*((GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::HalfedgeHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toHalfedgeHandle>
                         *)local_38);
    return (HalfedgeHandle)vVar2.super_BaseHandle.idx_.idx_;
  }
  __assert_fail("_start_vh.is_valid() && _end_vh.is_valid()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/UI233[P]Denoiser/OpenMesh/Core/Mesh/PolyConnectivity.cc"
                ,0x3a,
                "PolyConnectivity::HalfedgeHandle OpenMesh::PolyConnectivity::find_halfedge(VertexHandle, VertexHandle) const"
               );
}

Assistant:

PolyConnectivity::HalfedgeHandle
PolyConnectivity::find_halfedge(VertexHandle _start_vh, VertexHandle _end_vh ) const
{
  assert(_start_vh.is_valid() && _end_vh.is_valid());

  for (ConstVertexOHalfedgeIter voh_it = cvoh_iter(_start_vh); voh_it.is_valid(); ++voh_it)
    if (to_vertex_handle(*voh_it) == _end_vh)
      return *voh_it;

  return InvalidHalfedgeHandle;
}